

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

vec2f __thiscall Triangle::uv(Triangle *this,point *p)

{
  vec3f *in_RDI;
  vec2f vVar1;
  vec2f *a;
  vec3f *in_stack_fffffffffffffef0;
  
  a = (vec2f *)&in_RDI[6].z;
  ::operator-(a,(vec2f *)0x1850d8);
  ::operator-(in_stack_fffffffffffffef0,in_RDI);
  ::operator-(in_stack_fffffffffffffef0,in_RDI);
  cross(in_stack_fffffffffffffef0,in_RDI);
  norm((vec3f *)0x1851c1);
  ::operator*(a,0.0);
  ::operator*(a,0.0);
  ::operator+(a,(vec2f *)0x18520b);
  ::operator-(a,(vec2f *)0x185226);
  ::operator-(in_stack_fffffffffffffef0,in_RDI);
  ::operator-(in_stack_fffffffffffffef0,in_RDI);
  cross(in_stack_fffffffffffffef0,in_RDI);
  norm((vec3f *)0x1852c4);
  ::operator*(a,0.0);
  ::operator*(a,0.0);
  vVar1 = ::operator+(a,(vec2f *)0x18530f);
  return vVar1;
}

Assistant:

vec2f uv(const point& p) const
	{
		assert(onsurface(p));
		return
			vt1 + (vt3-vt1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vt2-vt1) * norm(cross(p-v1, v3-v1)) * one_by_2S; // TO OPTIMIZE
	}